

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O2

bool __thiscall EnumType::has_case(EnumType *this,string *case_name)

{
  pointer ppVar1;
  __type _Var2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0xffffffffffffffff;
  lVar5 = 0;
  do {
    ppVar1 = (this->cases).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->cases).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) / 0x28;
    uVar4 = uVar4 + 1;
    if (uVar3 <= uVar4) break;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(ppVar1->first)._M_dataplus._M_p + lVar5);
    lVar5 = lVar5 + 0x28;
    _Var2 = std::operator==(__lhs,case_name);
  } while (!_Var2);
  return uVar4 < uVar3;
}

Assistant:

bool has_case(const std::string& case_name) const {
		for (std::size_t i = 0; i < cases.size(); ++i) {
			if (cases[i].first == case_name) {
				return true;
			}
		}
		return false;
	}